

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

QDockAreaLayoutInfo * __thiscall
QDockAreaLayoutInfo::info(QDockAreaLayoutInfo *this,QList<int> *path)

{
  uint uVar1;
  QDockAreaLayoutInfo *this_00;
  Data *pDVar2;
  CutResult CVar3;
  pointer pQVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  QArrayData *d;
  qsizetype l;
  qsizetype p;
  QList<int> local_58;
  qsizetype local_40;
  qsizetype local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = *(path->d).ptr;
  uVar5 = (ulong)((int)uVar1 >> 0x1f ^ uVar1);
  if ((uVar5 < (ulong)(this->item_list).d.size) && ((path->d).size != 1)) {
    pQVar4 = QList<QDockAreaLayoutItem>::data(&this->item_list);
    if (pQVar4[uVar5].subinfo != (QDockAreaLayoutInfo *)0x0) {
      pQVar4 = QList<QDockAreaLayoutItem>::data(&this->item_list);
      this_00 = pQVar4[uVar5].subinfo;
      local_38 = 1;
      local_40 = -1;
      CVar3 = QtPrivate::QContainerImplHelper::mid((path->d).size,&local_38,&local_40);
      if (CVar3 < Full) {
        local_58.d.d = (Data *)0x0;
        local_58.d.ptr = (int *)0x0;
        local_58.d.size = 0;
      }
      else if (CVar3 == Full) {
        local_58.d.d = (path->d).d;
        local_58.d.ptr = (path->d).ptr;
        local_58.d.size = (path->d).size;
        if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
          super___atomic_base<int>._M_i =
               (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
               super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
      }
      else {
        local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.ptr =
             (int *)QArrayData::allocate((QArrayData **)&local_58,4,0x10,local_40,KeepSize);
        local_58.d.size = local_40;
        pDVar2 = local_58.d.d;
        if (local_40 == 0) {
          local_58.d.size = 0;
        }
        else {
          memcpy(local_58.d.ptr,(path->d).ptr + local_38,local_40 * 4);
        }
        local_58.d.d = pDVar2;
        if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
          LOCK();
          (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar2->super_QArrayData,4,0x10);
          }
        }
      }
      this = info(this_00,&local_58);
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,4,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QDockAreaLayoutInfo *QDockAreaLayoutInfo::info(const QList<int> &path)
{
    int index = path.first();
    if (index < 0)
        index = -index - 1;
    if (index >= item_list.size())
        return this;
    if (path.size() == 1 || item_list[index].subinfo == nullptr)
        return this;
    return item_list[index].subinfo->info(path.mid(1));
}